

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void windowCodeRangeTest(WindowCodeArg *p,int op,int csr1,int regVal,int csr2,int lbl)

{
  u8 uVar1;
  byte bVar2;
  Parse *pParse;
  int iVar3;
  Vdbe *p_00;
  Op *pOVar4;
  int reg;
  uint op_00;
  int iVar5;
  bool bVar6;
  int local_4c;
  
  pParse = p->pParse;
  p_00 = sqlite3GetVdbe(pParse);
  uVar1 = pParse->nTempReg;
  if (uVar1 == '\0') {
    reg = pParse->nMem + 1;
    pParse->nMem = reg;
  }
  else {
    bVar2 = uVar1 - 1;
    pParse->nTempReg = bVar2;
    reg = pParse->aTempReg[bVar2];
    if (bVar2 != 0) {
      pParse->nTempReg = uVar1 - 2;
      iVar5 = pParse->nMem;
      local_4c = pParse->aTempReg[(byte)(uVar1 - 2)];
      goto LAB_0019fe3e;
    }
  }
  iVar5 = pParse->nMem + 1;
  local_4c = iVar5;
LAB_0019fe3e:
  iVar5 = iVar5 + 1;
  pParse->nMem = iVar5;
  op_00 = 0x37;
  if (op != 0x39) {
    op_00 = op == 0x36 ^ 0x39;
  }
  bVar6 = p->pMWin->pOrderBy->a[0].sortOrder == '\0';
  if (bVar6) {
    op_00 = op;
  }
  windowReadPeerValues(p,csr1,reg);
  windowReadPeerValues(p,csr2,local_4c);
  iVar3 = sqlite3VdbeAddOp3(p_00,0x6e,0,iVar5,0);
  sqlite3VdbeChangeP4(p_00,iVar3,"",-1);
  iVar5 = sqlite3VdbeAddOp3(p_00,0x39,iVar5,0,reg);
  sqlite3VdbeAddOp3(p_00,bVar6 ^ 0x65,regVal,reg,reg);
  if (p_00->db->mallocFailed == '\0') {
    iVar3 = p_00->nOp + -1;
    if (-1 < iVar5) {
      iVar3 = iVar5;
    }
    pOVar4 = p_00->aOp + iVar3;
  }
  else {
    pOVar4 = (Op *)&sqlite3VdbeGetOp_dummy;
  }
  pOVar4->p2 = p_00->nOp;
  sqlite3VdbeAddOp3(p_00,op_00,local_4c,lbl,reg);
  if (0 < (long)p_00->nOp) {
    p_00->aOp[(long)p_00->nOp + -1].p5 = 0x80;
  }
  if (reg != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = reg;
    }
  }
  if (local_4c != 0) {
    bVar2 = pParse->nTempReg;
    if ((ulong)bVar2 < 8) {
      pParse->nTempReg = bVar2 + 1;
      pParse->aTempReg[bVar2] = local_4c;
    }
  }
  return;
}

Assistant:

static void windowCodeRangeTest(
  WindowCodeArg *p, 
  int op,                          /* OP_Ge or OP_Gt */
  int csr1, 
  int regVal, 
  int csr2,
  int lbl
){
  Parse *pParse = p->pParse;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int reg1 = sqlite3GetTempReg(pParse);
  int reg2 = sqlite3GetTempReg(pParse);
  int arith = OP_Add;
  int addrGe;

  int regString = ++pParse->nMem;

  assert( op==OP_Ge || op==OP_Gt || op==OP_Le );
  assert( p->pMWin->pOrderBy && p->pMWin->pOrderBy->nExpr==1 );
  if( p->pMWin->pOrderBy->a[0].sortOrder ){
    switch( op ){
      case OP_Ge: op = OP_Le; break;
      case OP_Gt: op = OP_Lt; break;
      default: assert( op==OP_Le ); op = OP_Ge; break;
    }
    arith = OP_Subtract;
  }

  windowReadPeerValues(p, csr1, reg1);
  windowReadPeerValues(p, csr2, reg2);

  /* Check if the peer value for csr1 value is a text or blob by comparing
  ** it to the smallest possible string - ''. If it is, jump over the
  ** OP_Add or OP_Subtract operation and proceed directly to the comparison. */
  sqlite3VdbeAddOp4(v, OP_String8, 0, regString, 0, "", P4_STATIC);
  addrGe = sqlite3VdbeAddOp3(v, OP_Ge, regString, 0, reg1);
  VdbeCoverage(v);
  sqlite3VdbeAddOp3(v, arith, regVal, reg1, reg1);
  sqlite3VdbeJumpHere(v, addrGe);
  sqlite3VdbeAddOp3(v, op, reg2, lbl, reg1); VdbeCoverage(v);
  sqlite3VdbeChangeP5(v, SQLITE_NULLEQ);
  assert( op==OP_Ge || op==OP_Gt || op==OP_Lt || op==OP_Le );
  testcase(op==OP_Ge); VdbeCoverageIf(v, op==OP_Ge);
  testcase(op==OP_Lt); VdbeCoverageIf(v, op==OP_Lt);
  testcase(op==OP_Le); VdbeCoverageIf(v, op==OP_Le);
  testcase(op==OP_Gt); VdbeCoverageIf(v, op==OP_Gt);

  sqlite3ReleaseTempReg(pParse, reg1);
  sqlite3ReleaseTempReg(pParse, reg2);
}